

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedArrayTest.cpp
# Opt level: O3

void __thiscall
compressed_array_check_find_check_Test::~compressed_array_check_find_check_Test
          (compressed_array_check_find_check_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(compressed_array_check, find_check) {
    vector<Record> records;

    records = create_records_1();
    CompressedArray array1(records);
    ASSERT_TRUE(search(records, array1));
    ASSERT_TRUE(array1.find(Key(0, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1000, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1998, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1001, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1999, 1)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1, 0)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1001, 0)) == array1.end());
    ASSERT_TRUE(array1.find(Key(1999, 0)) == array1.end());

    records = create_records_2();
    CompressedArray array2(records);
    ASSERT_TRUE(search(records, array2));
    ASSERT_TRUE(array2.find(Key(0, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1000, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1998, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1001, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1999, 1)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1, 0)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1001, 0)) == array2.end());
    ASSERT_TRUE(array2.find(Key(1999, 0)) == array2.end());

    records = create_records_3();
    CompressedArray array3(records);
    ASSERT_TRUE(search(records, array3));
    ASSERT_TRUE(array3.find(Key(0, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1000, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1998, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1001, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1999, 1)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1, 0)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1001, 0)) == array3.end());
    ASSERT_TRUE(array3.find(Key(1999, 0)) == array3.end());
}